

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.cc
# Opt level: O3

void __thiscall xemmai::t_fiber::t_internal::f_epoch_scan(t_internal *this)

{
  t_object ***ppptVar1;
  t_internal *ptVar2;
  t_engine *this_00;
  int iVar3;
  t_object *ptVar4;
  t_object **pptVar5;
  t_object **pptVar6;
  t_object **pptVar7;
  t_object **pptVar8;
  t_object **pptVar9;
  long in_FS_OFFSET;
  t_object **p1;
  t_object **p0;
  t_object **top1;
  t_object **top0;
  t_object **local_80;
  pthread_mutex_t *local_78;
  t_object **local_70;
  t_heap<xemmai::t_object> *local_68;
  _Head_base<0UL,_xemmai::t_object_**,_false> local_60;
  t_object **local_58;
  t_object **local_50;
  long local_48;
  t_internal *local_40;
  t_engine *local_38;
  
  local_70 = this->v_estack_last_used;
  pptVar8 = (t_object **)
            (((long)this->v_estack_used -
              (long)(this->v_estack)._M_t.
                    super___uniq_ptr_impl<xemmai::t_value<xemmai::t_pointer>,_std::default_delete<xemmai::t_value<xemmai::t_pointer>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_xemmai::t_value<xemmai::t_pointer>_*,_std::default_delete<xemmai::t_value<xemmai::t_pointer>[]>_>
                    .super__Head_base<0UL,_xemmai::t_value<xemmai::t_pointer>_*,_false>._M_head_impl
             >> 1) + (long)this->v_estack_last_head);
  this->v_estack_last_used = pptVar8;
  local_48 = (long)this->v_stack_bottom - (long)this->v_stack_top;
  pptVar9 = this->v_stack_copy;
  local_50 = (t_object **)((long)pptVar9 - local_48);
  pptVar6 = (t_object **)((long)this->v_stack_last_bottom - local_48);
  pptVar7 = this->v_stack_last_top;
  this->v_stack_last_top = pptVar6;
  local_38 = *(t_engine **)(in_FS_OFFSET + -0x60);
  local_78 = (pthread_mutex_t *)&(local_38->v_object__heap).v_mutex;
  local_58 = pptVar6;
  iVar3 = pthread_mutex_lock(local_78);
  this_00 = local_38;
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  local_60._M_head_impl =
       (this->v_estack_buffer)._M_t.
       super___uniq_ptr_impl<xemmai::t_object_*,_std::default_delete<xemmai::t_object_*[]>_>._M_t.
       super__Tuple_impl<0UL,_xemmai::t_object_**,_std::default_delete<xemmai::t_object_*[]>_>.
       super__Head_base<0UL,_xemmai::t_object_**,_false>._M_head_impl;
  ppptVar1 = &this->v_estack_decrements;
  this->v_estack_decrements = local_60._M_head_impl;
  local_80 = this->v_estack_last_head;
  pptVar5 = pptVar8;
  if (local_70 < pptVar8) {
    pptVar5 = local_70;
  }
  local_40 = this;
  t_engine::f_epoch_increment(local_38,&local_60._M_head_impl,&local_80,pptVar5,ppptVar1);
  local_68 = &this_00->v_object__heap;
  if (local_70 < pptVar8) {
    do {
      pptVar5 = local_60._M_head_impl + 1;
      ptVar4 = *local_60._M_head_impl;
      local_60._M_head_impl = pptVar5;
      if (((((ulong)ptVar4 & 0x7f) == 0) &&
          (ptVar4 = t_heap<xemmai::t_object>::f_find(local_68,ptVar4), ptVar4 != (t_object *)0x0))
         && (ptVar4->v_type != (t_type *)0x0)) {
        ptVar4->v_count = ptVar4->v_count + 1;
        ptVar4->v_color = c_color__BLACK;
      }
      else {
        ptVar4 = (t_object *)0x0;
      }
      pptVar5 = local_80 + 1;
      *local_80 = ptVar4;
      local_80 = pptVar5;
    } while (pptVar5 < pptVar8);
  }
  else {
    for (; local_80 < local_70; local_80 = local_80 + 1) {
      ptVar4 = *local_80;
      if (ptVar4 != (t_object *)0x0) {
        pptVar8 = *ppptVar1;
        *ppptVar1 = pptVar8 + 1;
        *pptVar8 = ptVar4;
      }
    }
  }
  ptVar2 = local_40;
  ppptVar1 = &local_40->v_stack_decrements;
  local_40->v_stack_decrements = local_40->v_stack_last_bottom;
  if (pptVar6 < pptVar7) {
    pptVar9 = pptVar9 + -(local_48 >> 3);
    do {
      pptVar8 = pptVar9 + 1;
      local_50 = pptVar8;
      if (((((ulong)*pptVar9 & 0x7f) == 0) &&
          (ptVar4 = t_heap<xemmai::t_object>::f_find(local_68,*pptVar9), ptVar4 != (t_object *)0x0))
         && (ptVar4->v_type != (t_type *)0x0)) {
        ptVar4->v_count = ptVar4->v_count + 1;
        ptVar4->v_color = c_color__BLACK;
      }
      else {
        ptVar4 = (t_object *)0x0;
      }
      local_58 = pptVar6 + 1;
      *pptVar6 = ptVar4;
      pptVar6 = local_58;
      pptVar9 = pptVar8;
    } while (local_58 < pptVar7);
  }
  else {
    for (; pptVar7 < pptVar6; pptVar7 = pptVar7 + 1) {
      ptVar4 = *pptVar7;
      if (ptVar4 != (t_object *)0x0) {
        pptVar9 = *ppptVar1;
        *ppptVar1 = pptVar9 + 1;
        *pptVar9 = ptVar4;
      }
    }
  }
  t_engine::f_epoch_increment(this_00,&local_50,&local_58,ptVar2->v_stack_last_bottom,ppptVar1);
  pthread_mutex_unlock(local_78);
  return;
}

Assistant:

void t_fiber::t_internal::f_epoch_scan()
{
	auto used1 = v_estack_last_head + (v_estack_used - v_estack.get());
	auto used2 = v_estack_last_used;
	v_estack_last_used = used1;
	auto n = v_stack_bottom - v_stack_top;
	auto top0 = v_stack_copy - n;
	auto top1 = v_stack_last_bottom - n;
	auto top2 = v_stack_last_top;
	v_stack_last_top = top1;
	auto engine = f_engine();
	std::lock_guard lock(engine->v_object__heap.f_mutex());
	auto p0 = v_estack_decrements = v_estack_buffer.get();
	auto p1 = v_estack_last_head;
	engine->f_epoch_increment(p0, p1, std::min(used1, used2), v_estack_decrements);
	auto increment = [&](auto& p0, auto& p1, auto p2)
	{
		do {
			auto p = engine->f_object__find(*p0++);
			if (p) p->f_increment();
			*p1++ = p;
		} while (p1 < p2);
	};
	if (used1 > used2)
		increment(p0, p1, used1);
	else
		for (; p1 < used2; ++p1) if (*p1) *v_estack_decrements++ = *p1;
	v_stack_decrements = v_stack_last_bottom;
	if (top1 < top2)
		increment(top0, top1, top2);
	else
		for (; top2 < top1; ++top2) if (*top2) *v_stack_decrements++ = *top2;
	engine->f_epoch_increment(top0, top1, v_stack_last_bottom, v_stack_decrements);
}